

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamwriter.cpp
# Opt level: O0

bool __thiscall QCborStreamWriterPrivate::closeContainer(QCborStreamWriterPrivate *this)

{
  bool bVar1;
  CborError CVar2;
  char *in_RDI;
  long in_FS_OFFSET;
  CborError err;
  CborEncoder container;
  CborEncoder *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  bool local_89;
  QMessageLogger local_88;
  QMessageLogger local_68;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QList<CborEncoder>::isEmpty((QList<CborEncoder> *)0x8df724);
  if (bVar1) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_RDI,in_stack_ffffffffffffff54,(char *)in_stack_ffffffffffffff48);
    QMessageLogger::warning(&local_28,"QCborStreamWriter: closing map or array that wasn\'t open");
    local_89 = false;
  }
  else {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    QStack<CborEncoder>::pop
              ((QStack<CborEncoder> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50))
    ;
    CVar2 = cbor_encoder_close_container(in_stack_ffffffffffffff48,(CborEncoder *)0x8df7bc);
    *(undefined1 **)(in_RDI + 8) = local_48;
    *(undefined1 **)(in_RDI + 0x10) = local_40;
    *(undefined1 **)(in_RDI + 0x18) = local_38;
    *(undefined1 **)(in_RDI + 0x20) = local_30;
    if (CVar2 == CborNoError) {
      local_89 = true;
    }
    else {
      if (CVar2 == CborErrorTooFewItems) {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(0x301,in_stack_ffffffffffffff60),in_RDI,
                   in_stack_ffffffffffffff54,(char *)in_stack_ffffffffffffff48);
        QMessageLogger::warning
                  (&local_68,"QCborStreamWriter: not enough items added to array or map");
      }
      else if (CVar2 == CborErrorTooManyItems) {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(0x300,in_stack_ffffffffffffff60),in_RDI,
                   in_stack_ffffffffffffff54,(char *)in_stack_ffffffffffffff48);
        QMessageLogger::warning(&local_88,"QCborStreamWriter: too many items added to array or map")
        ;
      }
      local_89 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_89;
}

Assistant:

bool closeContainer()
    {
        if (containerStack.isEmpty()) {
            qWarning("QCborStreamWriter: closing map or array that wasn't open");
            return false;
        }

        CborEncoder container = containerStack.pop();
        CborError err = cbor_encoder_close_container(&container, &encoder);
        encoder = container;

        if (Q_UNLIKELY(err)) {
            if (err == CborErrorTooFewItems)
                qWarning("QCborStreamWriter: not enough items added to array or map");
            else if (err == CborErrorTooManyItems)
                qWarning("QCborStreamWriter: too many items added to array or map");
            return false;
        }

        return true;
    }